

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_3::SingularString::GenerateOneofCopyConstruct
          (SingularString *this,Printer *p)

{
  char *pcVar1;
  undefined8 uStack_8;
  
  if (((this->super_FieldGeneratorBase).is_inlined_ == false) &&
     (*(long *)(*(long *)((this->super_FieldGeneratorBase).field_ + 0x50) + 8) != 0)) {
    pcVar1 = "new (&$field$) decltype($field$){arena, from.$field$, $default_variable_field$};\n";
    uStack_8 = 0x51;
  }
  else {
    pcVar1 = "new (&$field$) decltype($field$){arena, from.$field$};\n";
    uStack_8 = 0x37;
  }
  io::Printer::Emit(p,uStack_8,pcVar1);
  return;
}

Assistant:

void GenerateOneofCopyConstruct(io::Printer* p) const override {
    if (is_inlined() || EmptyDefault()) {
      p->Emit("new (&$field$) decltype($field$){arena, from.$field$};\n");
    } else {
      p->Emit(
          "new (&$field$) decltype($field$){arena, from.$field$,"
          " $default_variable_field$};\n");
    }
  }